

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluPrintConfig(int nVars,If_Grp_t *g,If_Grp_t *r,word BStruth,word *pFStruth)

{
  word wVar1;
  char cVar2;
  word BStruth_local;
  
  BStruth_local = BStruth;
  if ((nVars - g->nVars) + (uint)('\x02' < g->nMyu) + 1 == (int)r->nVars) {
    If_CluPrintGroup(g);
    cVar2 = g->nVars;
    if (cVar2 < 6) {
      BStruth_local = If_CluAdjust(BStruth,(int)cVar2);
      cVar2 = g->nVars;
    }
    Kit_DsdPrintFromTruth((uint *)&BStruth_local,(int)cVar2);
    putchar(10);
    If_CluPrintGroup(r);
    cVar2 = r->nVars;
    if (cVar2 < 6) {
      wVar1 = If_CluAdjust(*pFStruth,(int)cVar2);
      *pFStruth = wVar1;
      cVar2 = r->nVars;
    }
    Kit_DsdPrintFromTruth((uint *)pFStruth,(int)cVar2);
    putchar(10);
    return;
  }
  __assert_fail("r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                ,0x250,"void If_CluPrintConfig(int, If_Grp_t *, If_Grp_t *, word, word *)");
}

Assistant:

void If_CluPrintConfig( int nVars, If_Grp_t * g, If_Grp_t * r, word BStruth, word * pFStruth )
{
    assert( r->nVars == nVars - g->nVars + 1 + (g->nMyu > 2) );
    If_CluPrintGroup( g );
    if ( g->nVars < 6 )
        BStruth = If_CluAdjust( BStruth, g->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)&BStruth, g->nVars );
    printf( "\n" );
    If_CluPrintGroup( r );
    if ( r->nVars < 6 )
        pFStruth[0] = If_CluAdjust( pFStruth[0], r->nVars );
    Kit_DsdPrintFromTruth( (unsigned *)pFStruth, r->nVars );
    printf( "\n" );
}